

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QScreen * __thiscall QWidgetPrivate::associatedScreen(QWidgetPrivate *this)

{
  long lVar1;
  long lVar2;
  QWindow *pQVar3;
  QScreen *pQVar4;
  
  lVar2 = *(long *)&this->field_0x8;
  while( true ) {
    if (lVar2 == 0) {
      pQVar3 = windowHandle(this,Closest);
      if (pQVar3 == (QWindow *)0x0) {
        return (QScreen *)0x0;
      }
      pQVar4 = (QScreen *)QWindow::screen();
      return pQVar4;
    }
    lVar1 = *(long *)(*(long *)(lVar2 + 8) + 0x78);
    if ((lVar1 != 0) && (*(long *)(lVar1 + 0x10) != 0)) break;
    lVar2 = *(long *)(*(long *)(lVar2 + 8) + 0x10);
  }
  return (QScreen *)0x0;
}

Assistant:

QScreen *QWidgetPrivate::associatedScreen() const
{
#if QT_CONFIG(graphicsview)
    // embedded widgets never have a screen associated, let QWidget::screen fall back to toplevel
    if (nearestGraphicsProxyWidget(q_func()))
        return nullptr;
#endif
    if (auto window = windowHandle(WindowHandleMode::Closest))
        return window->screen();
    return nullptr;
}